

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::Path::toString
          (string *__return_storage_ptr__,Path *this,string *directoryPathSeparator)

{
  __type _Var1;
  Path *this_00;
  string path;
  string local_80;
  string local_60;
  string local_40;
  
  this_00 = this;
  ::std::__cxx11::string::string((string *)&local_40,(string *)this);
  removeRedundantDirectorySeparators(&local_80,this_00,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  _Var1 = ::std::operator==(&this->separator_,directoryPathSeparator);
  if (_Var1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,local_80.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_80.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_80._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,local_80.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_80._M_string_length;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_60,(string *)&local_80);
    StringUtils::replaceAll
              ((string *)__return_storage_ptr__,&local_60,(string *)&this->separator_,
               (string *)directoryPathSeparator);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  ::std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string Path::toString(const std::string& directoryPathSeparator) const
    {
        std::string path = removeRedundantDirectorySeparators(path_);

        if (separator_ == directoryPathSeparator)
        {
            return path;
        }
        return StringUtils::replaceAll(path, separator_, directoryPathSeparator);
    }